

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void __thiscall FSlide::SlideTraverse(FSlide *this,DVector2 *start,DVector2 *end)

{
  double dVar1;
  uint uVar2;
  line_t *line;
  AActor *pAVar3;
  bool bVar4;
  int iVar5;
  intercept_t *piVar6;
  DVector2 local_128;
  DVector3 pos;
  FPathTraverse it;
  FLineOpening open;
  
  FPathTraverse::FPathTraverse(&it,start->X,start->Y,end->X,end->Y,1,0.0);
  do {
    do {
      while( true ) {
        while( true ) {
          piVar6 = FPathTraverse::Next(&it);
          if (piVar6 == (intercept_t *)0x0) goto LAB_004aec22;
          if (piVar6->isaline != false) break;
          Printf("PTR_SlideTraverse: not a line?");
        }
        line = (piVar6->d).line;
        uVar2 = line->flags;
        if (((uVar2 & 4) != 0) && (line->backsector != (sector_t *)0x0)) break;
        AActor::PosRelative(&pos,this->slidemo,line);
        local_128.X = pos.X;
        local_128.Y = pos.Y;
        iVar5 = P_PointOnLineSide(&local_128,line);
        if (iVar5 == 0) goto LAB_004aebfd;
      }
      if ((((uVar2 & 0x8001) != 0) ||
          ((pAVar3 = this->slidemo, (uVar2 >> 0xe & 1) != 0 && (pAVar3->player != (player_t *)0x0)))
          ) || (((uVar2 & 2) != 0 &&
                ((((pAVar3->flags3).Value & 0x100000) == 0 &&
                 (((i_compatflags._3_1_ & 4) == 0 || (((pAVar3->flags).Value & 0x8000000) == 0))))))
               )) goto LAB_004aebfd;
      pos.X = piVar6->frac * it.trace.dx + it.trace.x;
      pos.Y = piVar6->frac * it.trace.dy + it.trace.y;
      P_LineOpening(&open,pAVar3,line,(DVector2 *)&pos,(DVector2 *)0x0,0);
      pAVar3 = this->slidemo;
      if ((open.range < pAVar3->Height) ||
         ((dVar1 = (pAVar3->__Pos).Z, open.top < pAVar3->Height + dVar1 ||
          (pAVar3->MaxStepHeight <= open.bottom - dVar1 &&
           open.bottom - dVar1 != pAVar3->MaxStepHeight)))) goto LAB_004aebfd;
    } while (open.bottom <= dVar1);
    (pAVar3->__Pos).Z = open.bottom;
    bVar4 = P_TestMobjZ(pAVar3,true,(AActor **)0x0);
    (this->slidemo->__Pos).Z = dVar1;
  } while (bVar4);
LAB_004aebfd:
  dVar1 = piVar6->frac;
  if (dVar1 < this->bestSlidefrac) {
    this->secondSlidefrac = this->bestSlidefrac;
    this->secondslideline = this->bestslideline;
    this->bestSlidefrac = dVar1;
    this->bestslideline = line;
  }
LAB_004aec22:
  FPathTraverse::~FPathTraverse(&it);
  return;
}

Assistant:

void FSlide::SlideTraverse(const DVector2 &start, const DVector2 &end)
{
	FLineOpening open;
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES);
	intercept_t *in;

	while ((in = it.Next()))
	{
		line_t* 	li;

		if (!in->isaline)
		{
			// should never happen
			Printf("PTR_SlideTraverse: not a line?");
			continue;
		}

		li = in->d.line;

		if (!(li->flags & ML_TWOSIDED) || !li->backsector)
		{
			DVector3 pos = slidemo->PosRelative(li);
			if (P_PointOnLineSide(pos, li))
			{
				// don't hit the back side
				continue;
			}
			goto isblocking;
		}
		if (li->flags & (ML_BLOCKING | ML_BLOCKEVERYTHING))
		{
			goto isblocking;
		}
		if (li->flags & ML_BLOCK_PLAYERS && slidemo->player != NULL)
		{
			goto isblocking;
		}
		if (li->flags & ML_BLOCKMONSTERS && !((slidemo->flags3 & MF3_NOBLOCKMONST)
			|| ((i_compatflags & COMPATF_NOBLOCKFRIENDS) && (slidemo->flags & MF_FRIENDLY))))
		{
			goto isblocking;
		}

		// set openrange, opentop, openbottom
		P_LineOpening(open, slidemo, li, it.InterceptPoint(in));

		if (open.range < slidemo->Height)
			goto isblocking;				// doesn't fit

		if (open.top < slidemo->Top())
			goto isblocking;				// mobj is too high

		if (open.bottom - slidemo->Z() > slidemo->MaxStepHeight)
		{
			goto isblocking;				// too big a step up
		}
		else if (slidemo->Z() < open.bottom)
		{ // [RH] Check to make sure there's nothing in the way for the step up
			double savedz = slidemo->Z();
			slidemo->SetZ(open.bottom);
			bool good = P_TestMobjZ(slidemo);
			slidemo->SetZ(savedz);
			if (!good)
			{
				goto isblocking;
			}
		}

		// this line doesn't block movement
		continue;

		// the line does block movement,
		// see if it is closer than best so far
	isblocking:
		if (in->frac < bestSlidefrac)
		{
			secondSlidefrac = bestSlidefrac;
			secondslideline = bestslideline;
			bestSlidefrac = in->frac;
			bestslideline = li;
		}

		return;		// stop
	}
}